

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa_minimization.h
# Opt level: O0

vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
* wasm::DFA::refinePartitions<wasm::HeapType>
            (vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
             *__return_storage_ptr__,
            vector<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
            *partitions)

{
  pointer this;
  pointer this_00;
  bool bVar1;
  reference this_01;
  reference __x;
  size_type sVar2;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *this_02;
  pointer ppVar3;
  reference puVar4;
  reference __x_00;
  pair<std::__detail::_Node_iterator<std::pair<const_wasm::HeapType,_unsigned_long>,_false,_true>,_bool>
  pVar5;
  size_t index;
  const_iterator __end3;
  const_iterator __begin3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range3_2;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> partition_2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *indexPartition_1;
  iterator __end2;
  iterator __begin2;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *__range2_2;
  undefined1 local_1c8 [8];
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  indexResults;
  _Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_long>,_true> local_1a8;
  iterator it;
  HeapType *succ;
  const_iterator __end0_4;
  const_iterator __begin0_4;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__range4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> succIndices;
  State<wasm::HeapType> *state_1;
  const_iterator __end0_3;
  const_iterator __begin0_3;
  vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>
  *__range3_1;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  indexPartition;
  vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>
  *partition_1;
  const_iterator __end0_2;
  const_iterator __begin0_2;
  vector<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
  *__range2_1;
  vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  indexPartitions;
  size_type local_d8;
  pair<const_wasm::HeapType,_unsigned_long> local_d0;
  _Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_long>,_true> local_c0;
  byte local_b8;
  byte local_a9;
  reference pSStack_a8;
  bool inserted;
  State<wasm::HeapType> *state;
  const_iterator __end0_1;
  const_iterator __begin0_1;
  vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>
  *__range3;
  vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>
  *partition;
  const_iterator __end0;
  const_iterator __begin0;
  vector<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
  *__range2;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> values;
  unordered_map<wasm::HeapType,_unsigned_long,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>_>
  indices;
  vector<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
  *partitions_local;
  vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
  *results;
  
  std::
  unordered_map<wasm::HeapType,_unsigned_long,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>_>
  ::unordered_map((unordered_map<wasm::HeapType,_unsigned_long,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>_>
                   *)&values.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&__range2);
  __end0 = std::
           vector<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
           ::begin(partitions);
  partition = (vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>
               *)std::
                 vector<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
                 ::end(partitions);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<const_std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_*,_std::vector<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>
                                *)&partition);
    if (!bVar1) {
      std::
      vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
      ::vector((vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                *)&__range2_1);
      sVar2 = std::
              vector<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
              ::size(partitions);
      std::
      vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
      ::reserve((vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                 *)&__range2_1,sVar2);
      __end0_2 = std::
                 vector<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
                 ::begin(partitions);
      partition_1 = (vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>
                     *)std::
                       vector<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
                       ::end(partitions);
      do {
        bVar1 = __gnu_cxx::operator!=
                          (&__end0_2,
                           (__normal_iterator<const_std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_*,_std::vector<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>
                            *)&partition_1);
        if (!bVar1) {
          Internal::refinePartitionsImpl
                    ((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      *)local_1c8,(InputGraph *)&__range2_1);
          std::
          vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
          ::vector(__return_storage_ptr__);
          sVar2 = std::
                  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ::size((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                          *)local_1c8);
          std::
          vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
          ::reserve(__return_storage_ptr__,sVar2);
          __end2 = std::
                   vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ::begin((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                            *)local_1c8);
          indexPartition_1 =
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               std::
               vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ::end((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      *)local_1c8);
          while (bVar1 = __gnu_cxx::operator!=
                                   (&__end2,(__normal_iterator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                                             *)&indexPartition_1), bVar1) {
            partition_2.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 (pointer)__gnu_cxx::
                          __normal_iterator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                          ::operator*(&__end2);
            std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
                      ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&__range3_2);
            sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               partition_2.
                               super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
            std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::reserve
                      ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&__range3_2,sVar2)
            ;
            this = partition_2.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
            __end3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                               ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                partition_2.
                                super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
            index = (size_t)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this
                                      );
            while (bVar1 = __gnu_cxx::operator!=
                                     (&__end3,(__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                               *)&index), bVar1) {
              puVar4 = __gnu_cxx::
                       __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                       ::operator*(&__end3);
              __x_00 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                                 ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                                  &__range2,*puVar4);
              std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back
                        ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&__range3_2,
                         __x_00);
              __gnu_cxx::
              __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              ::operator++(&__end3);
            }
            std::
            vector<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,std::allocator<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>
            ::emplace_back<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                      ((vector<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,std::allocator<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>
                        *)__return_storage_ptr__,
                       (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&__range3_2);
            std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
                      ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&__range3_2);
            __gnu_cxx::
            __normal_iterator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
            ::operator++(&__end2);
          }
          std::
          vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     *)local_1c8);
          std::
          vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
          ::~vector((vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                     *)&__range2_1);
          std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
                    ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&__range2);
          std::
          unordered_map<wasm::HeapType,_unsigned_long,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>_>
          ::~unordered_map((unordered_map<wasm::HeapType,_unsigned_long,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>_>
                            *)&values.
                               super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
          return __return_storage_ptr__;
        }
        indexPartition.
        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)__gnu_cxx::
                      __normal_iterator<const_std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_*,_std::vector<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>
                      ::operator*(&__end0_2);
        std::
        vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ::vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  *)&__range3_1);
        sVar2 = std::
                vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>
                ::size((vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>
                        *)indexPartition.
                          super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ::reserve((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   *)&__range3_1,sVar2);
        this_00 = indexPartition.
                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        __end0_3 = std::
                   vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>
                   ::begin((vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>
                            *)indexPartition.
                              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
        state_1 = (State<wasm::HeapType> *)
                  std::
                  vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>
                  ::end((vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>
                         *)this_00);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end0_3,
                                  (__normal_iterator<const_wasm::DFA::State<wasm::HeapType>_*,_std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>
                                   *)&state_1), bVar1) {
          succIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)__gnu_cxx::
                        __normal_iterator<const_wasm::DFA::State<wasm::HeapType>_*,_std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>
                        ::operator*(&__end0_3);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range4);
          sVar2 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::size
                            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                             (succIndices.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range4,sVar2);
          this_02 = (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                    (succIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
          __end0_4 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::begin(this_02);
          succ = (HeapType *)
                 std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::end(this_02);
          while (bVar1 = __gnu_cxx::operator!=
                                   (&__end0_4,
                                    (__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                                     *)&succ), bVar1) {
            it.super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_long>,_true>.
            _M_cur = (_Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_long>,_true>)
                     __gnu_cxx::
                     __normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                     ::operator*(&__end0_4);
            local_1a8._M_cur =
                 (__node_type *)
                 std::
                 unordered_map<wasm::HeapType,_unsigned_long,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>_>
                 ::find((unordered_map<wasm::HeapType,_unsigned_long,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>_>
                         *)&values.
                            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                        (key_type *)
                        it.
                        super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_long>,_true>
                        ._M_cur);
            indexResults.
            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)std::
                          unordered_map<wasm::HeapType,_unsigned_long,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>_>
                          ::end((unordered_map<wasm::HeapType,_unsigned_long,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>_>
                                 *)&values.
                                    super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
            bVar1 = std::__detail::operator!=
                              (&local_1a8,
                               (_Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_long>,_true>
                                *)&indexResults.
                                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
            if (!bVar1) {
              __assert_fail("it != indices.end() && \"unknown successor value\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/dfa_minimization.h"
                            ,0x4b,
                            "std::vector<std::vector<T>> wasm::DFA::refinePartitions(const std::vector<std::vector<State<T>>> &) [T = wasm::HeapType]"
                           );
            }
            ppVar3 = std::__detail::
                     _Node_iterator<std::pair<const_wasm::HeapType,_unsigned_long>,_false,_true>::
                     operator->((_Node_iterator<std::pair<const_wasm::HeapType,_unsigned_long>,_false,_true>
                                 *)&local_1a8);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range4,
                       &ppVar3->second);
            __gnu_cxx::
            __normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
            ::operator++(&__end0_4);
          }
          std::
          vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
          ::emplace_back<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                    ((vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                      *)&__range3_1,
                     (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range4);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range4);
          __gnu_cxx::
          __normal_iterator<const_wasm::DFA::State<wasm::HeapType>_*,_std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>
          ::operator++(&__end0_3);
        }
        std::
        vector<std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>,std::allocator<std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>
        ::
        emplace_back<std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
                  ((vector<std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>,std::allocator<std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>
                    *)&__range2_1,
                   (vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    *)&__range3_1);
        std::
        vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   *)&__range3_1);
        __gnu_cxx::
        __normal_iterator<const_std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_*,_std::vector<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>
        ::operator++(&__end0_2);
      } while( true );
    }
    this_01 = __gnu_cxx::
              __normal_iterator<const_std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_*,_std::vector<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>
              ::operator*(&__end0);
    __end0_1 = std::
               vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>
               ::begin(this_01);
    state = (State<wasm::HeapType> *)
            std::
            vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>
            ::end(this_01);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end0_1,
                              (__normal_iterator<const_wasm::DFA::State<wasm::HeapType>_*,_std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>
                               *)&state), bVar1) {
      __x = __gnu_cxx::
            __normal_iterator<const_wasm::DFA::State<wasm::HeapType>_*,_std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>
            ::operator*(&__end0_1);
      pSStack_a8 = __x;
      local_d8 = std::
                 unordered_map<wasm::HeapType,_unsigned_long,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>_>
                 ::size((unordered_map<wasm::HeapType,_unsigned_long,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>_>
                         *)&values.
                            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::pair<const_wasm::HeapType,_unsigned_long>::pair<unsigned_long,_true>
                (&local_d0,&__x->val,&local_d8);
      pVar5 = std::
              unordered_map<wasm::HeapType,_unsigned_long,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>_>
              ::insert((unordered_map<wasm::HeapType,_unsigned_long,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>_>
                        *)&values.
                           super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,&local_d0);
      indexPartitions.
      super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)pVar5.first.
                    super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_long>,_true>.
                    _M_cur;
      local_b8 = pVar5.second;
      local_a9 = local_b8 & 1;
      local_c0._M_cur =
           (__node_type *)
           indexPartitions.
           super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        __assert_fail("inserted && \"unexpected repeated value\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/dfa_minimization.h"
                      ,0x3b,
                      "std::vector<std::vector<T>> wasm::DFA::refinePartitions(const std::vector<std::vector<State<T>>> &) [T = wasm::HeapType]"
                     );
      }
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&__range2,
                 &pSStack_a8->val);
      __gnu_cxx::
      __normal_iterator<const_wasm::DFA::State<wasm::HeapType>_*,_std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>
      ::operator++(&__end0_1);
    }
    __gnu_cxx::
    __normal_iterator<const_std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_*,_std::vector<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>
    ::operator++(&__end0);
  } while( true );
}

Assistant:

std::vector<std::vector<T>>
refinePartitions(const std::vector<std::vector<State<T>>>& partitions) {
  // Map values to indices and vice versa.
  std::unordered_map<T, size_t> indices;
  std::vector<T> values;
  for (const auto& partition : partitions) {
    for (const auto& state : partition) {
      [[maybe_unused]] bool inserted =
        indices.insert({state.val, indices.size()}).second;
      assert(inserted && "unexpected repeated value");
      values.push_back(state.val);
    }
  }

  // Create a copy of the DFA that uses indices instead of the original values.
  std::vector<std::vector<std::vector<size_t>>> indexPartitions;
  indexPartitions.reserve(partitions.size());
  for (const auto& partition : partitions) {
    std::vector<std::vector<size_t>> indexPartition;
    indexPartition.reserve(partition.size());
    for (const auto& state : partition) {
      std::vector<size_t> succIndices;
      succIndices.reserve(state.succs.size());
      for (const auto& succ : state.succs) {
        auto it = indices.find(succ);
        assert(it != indices.end() && "unknown successor value");
        succIndices.push_back(it->second);
      }
      indexPartition.emplace_back(std::move(succIndices));
    }
    indexPartitions.emplace_back(std::move(indexPartition));
  }

  // Refine the partitions.
  auto indexResults = Internal::refinePartitionsImpl(indexPartitions);

  // Map the refined partitions of indices back to values.
  std::vector<std::vector<T>> results;
  results.reserve(indexResults.size());
  for (const auto& indexPartition : indexResults) {
    std::vector<T> partition;
    partition.reserve(indexPartition.size());
    for (size_t index : indexPartition) {
      partition.push_back(values[index]);
    }
    results.emplace_back(std::move(partition));
  }

  return results;
}